

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O2

void __thiscall Message::Message(Message *this,msg_type_t _type)

{
  this->msg_type = _type;
  (this->o)._M_dataplus._M_p = (pointer)&(this->o).field_2;
  (this->o)._M_string_length = 0;
  (this->o).field_2._M_local_buf[0] = '\0';
  this->c = 0;
  (this->d)._M_dataplus._M_p = (pointer)&(this->d).field_2;
  (this->d)._M_string_length = 0;
  (this->d).field_2._M_local_buf[0] = '\0';
  this->v = 0;
  this->n = 0;
  this->i = 0;
  (this->m)._M_dataplus._M_p = (pointer)&(this->m).field_2;
  (this->m)._M_string_length = 0;
  (this->m).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Message::Message(msg_type_t _type):msg_type(_type) {
}